

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O0

torrent_handle __thiscall
libtorrent::session_handle::add_torrent
          (session_handle *this,add_torrent_params *params,error_code *ec)

{
  bool bVar1;
  error_code *in_RCX;
  torrent_handle tVar2;
  reference_wrapper<boost::system::error_code> ecr;
  error_code *ec_local;
  add_torrent_params *params_local;
  session_handle *this_local;
  
  bVar1 = info_hash_t::has_v1((info_hash_t *)&ec[0x12].failed_);
  if (((!bVar1) && (bVar1 = info_hash_t::has_v2((info_hash_t *)&ec[0x12].failed_), !bVar1)) &&
     (bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&ec->cat_), !bVar1)) {
    *(undefined8 *)&ec[0x12].failed_ = *(undefined8 *)(ec + 0x11);
    *(error_category **)((long)&ec[0x12].cat_ + 4) = ec[0x11].cat_;
    *(int *)&ec[0x13].failed_ = ec[0x12].val_;
  }
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&ec->cat_);
  if (bVar1) {
    ::std::__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)&ec->cat_);
    ::std::make_shared<libtorrent::torrent_info,libtorrent::torrent_info&>((torrent_info *)&ecr);
    ::std::shared_ptr<libtorrent::torrent_info>::operator=
              ((shared_ptr<libtorrent::torrent_info> *)&ec->cat_,
               (shared_ptr<libtorrent::torrent_info> *)&ecr);
    ::std::shared_ptr<libtorrent::torrent_info>::~shared_ptr
              ((shared_ptr<libtorrent::torrent_info> *)&ecr);
  }
  boost::system::error_code::clear(in_RCX);
  ::std::ref<boost::system::error_code>(in_RCX);
  tVar2 = sync_call_ret<libtorrent::torrent_handle,libtorrent::torrent_handle(libtorrent::aux::session_impl::*)(libtorrent::add_torrent_params&&,boost::system::error_code&),libtorrent::add_torrent_params,std::reference_wrapper<boost::system::error_code>&>
                    (this,(offset_in_session_impl_to_subr)params,
                     (add_torrent_params *)libtorrent::aux::session_impl::add_torrent,
                     (reference_wrapper<boost::system::error_code> *)0x0);
  tVar2.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (torrent_handle)
         tVar2.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

torrent_handle session_handle::add_torrent(add_torrent_params&& params, error_code& ec)
	{
		TORRENT_ASSERT_PRECOND(!params.save_path.empty());

#if TORRENT_ABI_VERSION < 3
		if (!params.info_hashes.has_v1() && !params.info_hashes.has_v2() && !params.ti)
			params.info_hashes.v1 = params.info_hash;
#endif

		// the internal torrent object keeps and mutates state in the
		// torrent_info object. We can't let that leak back to the client
		if (params.ti)
			params.ti = std::make_shared<torrent_info>(*params.ti);

		ec.clear();
#if TORRENT_ABI_VERSION == 1
		handle_backwards_compatible_resume_data(params);
#endif
		auto ecr = std::ref(ec);
		return sync_call_ret<torrent_handle>(&session_impl::add_torrent, std::move(params), ecr);
	}